

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.c
# Opt level: O2

int labeled_extract(ptls_hpke_kem_t *kem,ptls_hpke_cipher_suite_t *cipher,void *output,
                   ptls_iovec_t salt,char *label,ptls_iovec_t ikm)

{
  int iVar1;
  size_t len;
  ptls_iovec_t ikm_00;
  ptls_buffer_t labeled_ikm;
  uint8_t labeled_ikm_smallbuf [64];
  
  labeled_ikm.base = labeled_ikm_smallbuf;
  labeled_ikm.off = 0;
  labeled_ikm.capacity = 0x40;
  labeled_ikm.is_allocated = '\0';
  labeled_ikm.align_bits = '\0';
  iVar1 = ptls_buffer__do_pushv(&labeled_ikm,"HPKE-v1",7);
  if (iVar1 == 0) {
    iVar1 = build_suite_id(&labeled_ikm,kem,cipher);
    if (iVar1 == 0) {
      len = strlen(label);
      iVar1 = ptls_buffer__do_pushv(&labeled_ikm,label,len);
      if (iVar1 == 0) {
        iVar1 = ptls_buffer__do_pushv(&labeled_ikm,ikm.base,ikm.len);
        if (iVar1 == 0) {
          if (cipher != (ptls_hpke_cipher_suite_t *)0x0) {
            kem = (ptls_hpke_kem_t *)cipher;
          }
          ikm_00.len = labeled_ikm.off;
          ikm_00.base = labeled_ikm.base;
          iVar1 = ptls_hkdf_extract(((ptls_hpke_cipher_suite_t *)kem)->hash,output,salt,ikm_00);
        }
      }
    }
  }
  ptls_buffer_dispose(&labeled_ikm);
  return iVar1;
}

Assistant:

static int labeled_extract(ptls_hpke_kem_t *kem, ptls_hpke_cipher_suite_t *cipher, void *output, ptls_iovec_t salt,
                           const char *label, ptls_iovec_t ikm)
{
    ptls_buffer_t labeled_ikm;
    uint8_t labeled_ikm_smallbuf[64];
    int ret;

    ptls_buffer_init(&labeled_ikm, labeled_ikm_smallbuf, sizeof(labeled_ikm_smallbuf));

    ptls_buffer_pushv(&labeled_ikm, HPKE_V1_LABEL, strlen(HPKE_V1_LABEL));
    if ((ret = build_suite_id(&labeled_ikm, kem, cipher)) != 0)
        goto Exit;
    ptls_buffer_pushv(&labeled_ikm, label, strlen(label));
    ptls_buffer_pushv(&labeled_ikm, ikm.base, ikm.len);

    ret = ptls_hkdf_extract(cipher != NULL ? cipher->hash : kem->hash, output, salt,
                            ptls_iovec_init(labeled_ikm.base, labeled_ikm.off));

Exit:
    ptls_buffer_dispose(&labeled_ikm);
    return ret;
}